

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O0

int test_HTMLtree(void)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  uint uVar19;
  int test_ret;
  
  if (quiet == 0) {
    printf("Testing HTMLtree : 18 of 18 functions ...\n");
  }
  iVar1 = test_htmlDocContentDumpFormatOutput();
  iVar2 = test_htmlDocContentDumpOutput();
  iVar3 = test_htmlDocDump();
  iVar4 = test_htmlDocDumpMemory();
  iVar5 = test_htmlDocDumpMemoryFormat();
  iVar6 = test_htmlGetMetaEncoding();
  iVar7 = test_htmlIsBooleanAttr();
  iVar8 = test_htmlNewDoc();
  iVar9 = test_htmlNewDocNoDtD();
  iVar10 = test_htmlNodeDump();
  iVar11 = test_htmlNodeDumpFile();
  iVar12 = test_htmlNodeDumpFileFormat();
  iVar13 = test_htmlNodeDumpFormatOutput();
  iVar14 = test_htmlNodeDumpOutput();
  iVar15 = test_htmlSaveFile();
  iVar16 = test_htmlSaveFileEnc();
  iVar17 = test_htmlSaveFileFormat();
  iVar18 = test_htmlSetMetaEncoding();
  uVar19 = iVar18 + iVar17 + iVar16 + iVar15 + iVar14 + iVar13 + iVar12 + iVar11 + iVar10 + iVar9 + 
                                                  iVar8 + iVar7 + iVar6 + iVar5 + iVar4 + iVar3 + 
                                                  iVar2 + iVar1;
  if (uVar19 != 0) {
    printf("Module HTMLtree: %d errors\n",(ulong)uVar19);
  }
  return uVar19;
}

Assistant:

static int
test_HTMLtree(void) {
    int test_ret = 0;

    if (quiet == 0) printf("Testing HTMLtree : 18 of 18 functions ...\n");
    test_ret += test_htmlDocContentDumpFormatOutput();
    test_ret += test_htmlDocContentDumpOutput();
    test_ret += test_htmlDocDump();
    test_ret += test_htmlDocDumpMemory();
    test_ret += test_htmlDocDumpMemoryFormat();
    test_ret += test_htmlGetMetaEncoding();
    test_ret += test_htmlIsBooleanAttr();
    test_ret += test_htmlNewDoc();
    test_ret += test_htmlNewDocNoDtD();
    test_ret += test_htmlNodeDump();
    test_ret += test_htmlNodeDumpFile();
    test_ret += test_htmlNodeDumpFileFormat();
    test_ret += test_htmlNodeDumpFormatOutput();
    test_ret += test_htmlNodeDumpOutput();
    test_ret += test_htmlSaveFile();
    test_ret += test_htmlSaveFileEnc();
    test_ret += test_htmlSaveFileFormat();
    test_ret += test_htmlSetMetaEncoding();

    if (test_ret != 0)
	printf("Module HTMLtree: %d errors\n", test_ret);
    return(test_ret);
}